

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

ImPlotPoint __thiscall ImPlot::GetterXsYs<double>::operator()(GetterXsYs<double> *this,int idx)

{
  double _x;
  double _y;
  int idx_local;
  GetterXsYs<double> *this_local;
  
  _x = OffsetAndStride<double>(this->Xs,idx,this->Count,this->Offset,this->Stride);
  _y = OffsetAndStride<double>(this->Ys,idx,this->Count,this->Offset,this->Stride);
  ImPlotPoint::ImPlotPoint((ImPlotPoint *)&this_local,_x,_y);
  return _this_local;
}

Assistant:

inline ImPlotPoint operator()(int idx) const {
        return ImPlotPoint((double)OffsetAndStride(Xs, idx, Count, Offset, Stride), (double)OffsetAndStride(Ys, idx, Count, Offset, Stride));
    }